

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

string * __thiscall
cinatra::get_content_type_str_abi_cxx11_
          (string *__return_storage_ptr__,cinatra *this,req_content_type type)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((uint)this < 9) && ((0x1dfU >> ((uint)this & 0x1f) & 1) != 0)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (__return_storage_ptr__,
               &DAT_0016fe5c + *(int *)(&DAT_0016fe5c + ((ulong)this & 0xffffffff) * 4));
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string get_content_type_str(req_content_type type) {
  std::string str;
  switch (type) {
    case req_content_type::html:
      str = "text/html; charset=UTF-8";
      break;
    case req_content_type::json:
      str = "application/json; charset=UTF-8";
      break;
    case req_content_type::text:
      str = "text/plain";
      break;
    case req_content_type::string:
      str = "text/html; charset=UTF-8";
      break;
    case req_content_type::multipart:
      str = "multipart/form-data; boundary=";
      break;
    case req_content_type::form_url_encode:
      str = "application/x-www-form-urlencoded";
      break;
    case req_content_type::octet_stream:
      str = "application/octet-stream";
      break;
    case req_content_type::xml:
      str = "application/xml";
      break;
    case req_content_type::none:
    default:
      break;
  }

  return str;
}